

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O3

void nes_set_chip_option_fds(NESAPU_INF *info,UINT32 NesOptions)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 10;
  do {
    NES_FDS_SetOption(info->chip_fds,uVar2 - 9,(uint)((NesOptions >> (uVar2 & 0x1f) & 1) != 0));
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0xc);
  iVar1 = NES_FDS_GetOption(info->chip_fds,2);
  info->fds_disable = (UINT8)iVar1;
  return;
}

Assistant:

static void nes_set_chip_option_fds(NESAPU_INF* info, UINT32 NesOptions)
{
	UINT8 CurOpt;
	
	// FDS options
	// I skip the Cutoff frequency here, since it's not a boolean value.
	for (CurOpt = 10; CurOpt < 12; CurOpt ++)
		NES_FDS_SetOption(info->chip_fds, CurOpt-10+1, (NesOptions >> CurOpt) & 0x01);
	info->fds_disable = NES_FDS_GetOption(info->chip_fds, FDS_OPT_WRITE_PROTECT);
	
	return;
}